

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::SetAllocatedMessage
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor,
          MessageLite *message)

{
  bool bVar1;
  CppType CVar2;
  Arena *pAVar3;
  anon_union_8_21_e6ad415f_for_Extension_0 aVar4;
  LogMessage *pLVar5;
  anon_union_8_21_e6ad415f_for_Extension_0 aVar6;
  LogFinisher local_182;
  byte local_181;
  LogMessage local_180;
  LogFinisher local_142;
  byte local_141;
  LogMessage local_140;
  LogFinisher local_102;
  byte local_101;
  LogMessage local_100;
  Extension *local_c8;
  Extension *extension;
  Arena *message_arena;
  byte local_a1;
  LogMessage local_a0;
  ExtensionSet *local_68;
  MessageLite *message_local;
  FieldDescriptor *descriptor_local;
  FieldType type_local;
  ExtensionSet *pEStack_50;
  int number_local;
  ExtensionSet *this_local;
  ThreadSafeArena *local_40;
  ExtensionSet *local_38;
  ThreadSafeArena *local_30;
  ExtensionSet *local_28;
  ThreadSafeArena *local_20;
  ExtensionSet *local_18;
  ThreadSafeArena *local_10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  local_68 = (ExtensionSet *)message;
  message_local = (MessageLite *)descriptor;
  descriptor_local._3_1_ = type;
  descriptor_local._4_4_ = number;
  pEStack_50 = this;
  if (message == (MessageLite *)0x0) {
    ClearExtension(this,number);
  }
  else {
    pAVar3 = MessageLite::GetOwningArena(message);
    local_a1 = 0;
    if ((pAVar3 != (Arena *)0x0) &&
       (pAVar3 = MessageLite::GetOwningArena((MessageLite *)local_68), pAVar3 != this->arena_)) {
      LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x2a6);
      local_a1 = 1;
      pLVar5 = LogMessage::operator<<
                         (&local_a0,
                          "CHECK failed: message->GetOwningArena() == nullptr || message->GetOwningArena() == arena_: "
                         );
      LogFinisher::operator=((LogFinisher *)((long)&message_arena + 3),pLVar5);
    }
    if ((local_a1 & 1) != 0) {
      LogMessage::~LogMessage(&local_a0);
    }
    extension = (Extension *)MessageLite::GetOwningArena((MessageLite *)local_68);
    bVar1 = MaybeNewExtension(this,descriptor_local._4_4_,(FieldDescriptor *)message_local,&local_c8
                             );
    if (bVar1) {
      local_c8->type = descriptor_local._3_1_;
      CVar2 = anon_unknown_22::cpp_type(local_c8->type);
      local_101 = 0;
      if (CVar2 != CPPTYPE_MESSAGE) {
        LogMessage::LogMessage
                  (&local_100,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                   ,0x2ab);
        local_101 = 1;
        pLVar5 = LogMessage::operator<<
                           (&local_100,
                            "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                           );
        LogFinisher::operator=(&local_102,pLVar5);
      }
      if ((local_101 & 1) != 0) {
        LogMessage::~LogMessage(&local_100);
      }
      local_c8->is_repeated = false;
      local_c8->field_0xa = local_c8->field_0xa & 0xf;
      if (extension == (Extension *)this->arena_) {
        (local_c8->field_0).message_value = (MessageLite *)local_68;
      }
      else if (extension == (Extension *)0x0) {
        (local_c8->field_0).message_value = (MessageLite *)local_68;
        local_30 = (ThreadSafeArena *)this->arena_;
        local_38 = local_68;
        local_28 = local_68;
        if (local_68 != (ExtensionSet *)0x0) {
          local_20 = local_30;
          ThreadSafeArena::AddCleanup
                    (local_30,local_68,arena_delete_object<google::protobuf::MessageLite>);
        }
      }
      else {
        aVar4._0_4_ = (**(_func_int **)(local_68->arena_ + 0x18))(local_68,this->arena_);
        aVar4.int64_t_value._4_4_ = extraout_var;
        local_c8->field_0 = aVar4;
        (*((local_c8->field_0).message_value)->_vptr_MessageLite[7])
                  ((local_c8->field_0).message_value,local_68);
      }
    }
    else {
      local_141 = 0;
      if ((local_c8->is_repeated & 1U) != 0) {
        LogMessage::LogMessage
                  (&local_140,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                   ,0x2b8);
        local_141 = 1;
        pLVar5 = LogMessage::operator<<
                           (&local_140,
                            "CHECK failed: ((*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD) == (OPTIONAL_FIELD): "
                           );
        LogFinisher::operator=(&local_142,pLVar5);
      }
      if ((local_141 & 1) != 0) {
        LogMessage::~LogMessage(&local_140);
      }
      CVar2 = anon_unknown_22::cpp_type(local_c8->type);
      local_181 = 0;
      if (CVar2 != CPPTYPE_MESSAGE) {
        LogMessage::LogMessage
                  (&local_180,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                   ,0x2b8);
        local_181 = 1;
        pLVar5 = LogMessage::operator<<
                           (&local_180,
                            "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                           );
        LogFinisher::operator=(&local_182,pLVar5);
      }
      if ((local_181 & 1) != 0) {
        LogMessage::~LogMessage(&local_180);
      }
      if (((byte)local_c8->field_0xa >> 4 & 1) == 0) {
        if ((this->arena_ == (Arena *)0x0) &&
           ((local_c8->field_0).message_value != (MessageLite *)0x0)) {
          (*((local_c8->field_0).message_value)->_vptr_MessageLite[1])();
        }
        if (extension == (Extension *)this->arena_) {
          (local_c8->field_0).message_value = (MessageLite *)local_68;
        }
        else if (extension == (Extension *)0x0) {
          (local_c8->field_0).message_value = (MessageLite *)local_68;
          local_40 = (ThreadSafeArena *)this->arena_;
          this_local = local_68;
          local_18 = local_68;
          if (local_68 != (ExtensionSet *)0x0) {
            local_10 = local_40;
            ThreadSafeArena::AddCleanup
                      (local_40,local_68,arena_delete_object<google::protobuf::MessageLite>);
          }
        }
        else {
          aVar6._0_4_ = (**(_func_int **)(local_68->arena_ + 0x18))(local_68,this->arena_);
          aVar6.int64_t_value._4_4_ = extraout_var_00;
          local_c8->field_0 = aVar6;
          (*((local_c8->field_0).message_value)->_vptr_MessageLite[7])
                    ((local_c8->field_0).message_value,local_68);
        }
      }
      else {
        (*((local_c8->field_0).message_value)->_vptr_MessageLite[5])
                  ((local_c8->field_0).message_value,local_68,this->arena_);
      }
    }
    local_c8->field_0xa = local_c8->field_0xa & 0xf0;
  }
  return;
}

Assistant:

void ExtensionSet::SetAllocatedMessage(int number, FieldType type,
                                       const FieldDescriptor* descriptor,
                                       MessageLite* message) {
  if (message == nullptr) {
    ClearExtension(number);
    return;
  }
  GOOGLE_DCHECK(message->GetOwningArena() == nullptr ||
         message->GetOwningArena() == arena_);
  Arena* message_arena = message->GetOwningArena();
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_lazy = false;
    if (message_arena == arena_) {
      extension->message_value = message;
    } else if (message_arena == nullptr) {
      extension->message_value = message;
      arena_->Own(message);  // not nullptr because not equal to message_arena
    } else {
      extension->message_value = message->New(arena_);
      extension->message_value->CheckTypeAndMergeFrom(*message);
    }
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    if (extension->is_lazy) {
      extension->lazymessage_value->SetAllocatedMessage(message, arena_);
    } else {
      if (arena_ == nullptr) {
        delete extension->message_value;
      }
      if (message_arena == arena_) {
        extension->message_value = message;
      } else if (message_arena == nullptr) {
        extension->message_value = message;
        arena_->Own(message);  // not nullptr because not equal to message_arena
      } else {
        extension->message_value = message->New(arena_);
        extension->message_value->CheckTypeAndMergeFrom(*message);
      }
    }
  }
  extension->is_cleared = false;
}